

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckInstr(SharedValidator *this,Opcode opcode,Location *loc)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  Enum EVar5;
  Opcode local_6c;
  Info local_68;
  
  sVar1 = (loc->filename)._M_len;
  pcVar2 = (loc->filename)._M_str;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar3;
  (this->expr_loc_).filename._M_len = sVar1;
  (this->expr_loc_).filename._M_str = pcVar2;
  EVar5 = Ok;
  if (this->in_init_expr_ == true) {
    local_6c.enum_ = opcode.enum_;
    bVar4 = ValidInitOpcode(this,opcode);
    EVar5 = Ok;
    if (!bVar4) {
      Opcode::GetInfo(&local_68,&local_6c);
      PrintError(this,loc,"invalid initializer: instruction not valid in initializer expression: %s"
                 ,local_68.name);
      EVar5 = Error;
    }
  }
  return (Result)EVar5;
}

Assistant:

Result SharedValidator::CheckInstr(Opcode opcode, const Location& loc) {
  expr_loc_ = loc;
  if (in_init_expr_ && !ValidInitOpcode(opcode)) {
    PrintError(loc,
               "invalid initializer: instruction not valid in initializer "
               "expression: %s",
               opcode.GetName());
    return Result::Error;
  }
  return Result::Ok;
}